

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBShuffleRow_C(uint8_t *src_argb,uint8_t *dst_argb,uint8_t *shuffler,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t a;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  int x;
  int index3;
  int index2;
  int index1;
  int index0;
  int width_local;
  uint8_t *shuffler_local;
  uint8_t *dst_argb_local;
  uint8_t *src_argb_local;
  
  bVar1 = *shuffler;
  bVar2 = shuffler[1];
  bVar3 = shuffler[2];
  bVar4 = shuffler[3];
  dst_argb_local = dst_argb;
  src_argb_local = src_argb;
  for (x = 0; x < width; x = x + 1) {
    uVar5 = src_argb_local[(int)(uint)bVar2];
    uVar6 = src_argb_local[(int)(uint)bVar3];
    uVar7 = src_argb_local[(int)(uint)bVar4];
    *dst_argb_local = src_argb_local[(int)(uint)bVar1];
    dst_argb_local[1] = uVar5;
    dst_argb_local[2] = uVar6;
    dst_argb_local[3] = uVar7;
    src_argb_local = src_argb_local + 4;
    dst_argb_local = dst_argb_local + 4;
  }
  return;
}

Assistant:

void ARGBShuffleRow_C(const uint8_t* src_argb,
                      uint8_t* dst_argb,
                      const uint8_t* shuffler,
                      int width) {
  int index0 = shuffler[0];
  int index1 = shuffler[1];
  int index2 = shuffler[2];
  int index3 = shuffler[3];
  // Shuffle a row of ARGB.
  int x;
  for (x = 0; x < width; ++x) {
    // To support in-place conversion.
    uint8_t b = src_argb[index0];
    uint8_t g = src_argb[index1];
    uint8_t r = src_argb[index2];
    uint8_t a = src_argb[index3];
    dst_argb[0] = b;
    dst_argb[1] = g;
    dst_argb[2] = r;
    dst_argb[3] = a;
    src_argb += 4;
    dst_argb += 4;
  }
}